

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxToken.cpp
# Opt level: O0

string * __thiscall
psy::C::to_string_abi_cxx11_(string *__return_storage_ptr__,C *this,Category category)

{
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  undefined4 local_14;
  string *psStack_10;
  Category category_local;
  
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xffffffff) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[keywords]",&local_15);
    std::allocator<char>::~allocator(&local_15);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[identifiers]",local_25);
    std::allocator<char>::~allocator(local_25);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[constants]",&local_26);
    std::allocator<char>::~allocator(&local_26);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[string literals]",&local_27);
    std::allocator<char>::~allocator(&local_27);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[punctuators]",&local_28);
    std::allocator<char>::~allocator(&local_28);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"[unrecognized]",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(SyntaxToken::Category category)
{
    switch (category) {
        case SyntaxToken::Category::Keywords:
            return "[keywords]";

        case SyntaxToken::Category::Identifiers:
            return "[identifiers]";

        case SyntaxToken::Category::Constants:
            return "[constants]";

        case SyntaxToken::Category::StringLiterals:
            return "[string literals]";

        case SyntaxToken::Category::Punctuators:
            return "[punctuators]";

        default:
            return "[unrecognized]";
    }
}